

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O2

l10n_arg * get_arg(l10n_arg *args,char *token)

{
  l10n_arg *plVar1;
  int iVar2;
  l10n_arg *plVar3;
  long lVar4;
  
  if (args == (l10n_arg *)0x0) {
    __assert_fail("args",
                  "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/l10n.c",
                  0x3e,"l10n_arg *get_arg(l10n_arg *, const char *)");
  }
  plVar3 = args + -1;
  lVar4 = 9;
  while ((lVar4 = lVar4 + -1, lVar4 != 0 && (plVar1 = plVar3 + 1, plVar1->name != (char *)0x0))) {
    plVar3 = plVar3 + 1;
    iVar2 = strcmp(plVar1->name + 1,token);
    if (iVar2 == 0) {
      return plVar3;
    }
  }
  return (l10n_arg *)0x0;
}

Assistant:

static l10n_arg *get_arg(l10n_arg *args, const char *token)
{
    int i;

    assert(args);
    for (i = 0; i != NUM_ARGS && args[i].name; ++i) {
        if (strcmp(args[i].name + 1, token) == 0) {
            return args + i;
        }
    }
    return NULL;
}